

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int eval_number(lyxp_expr *exp,uint16_t *exp_idx,lyxp_set *set)

{
  byte bVar1;
  int *piVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  longdouble in_ST0;
  char *local_38;
  char *endptr;
  
  if (set == (lyxp_set *)0x0) {
LAB_0016c9d8:
    if ('\x02' < ly_log_level) {
      pcVar3 = "parsed";
      if (set == (lyxp_set *)0x0) {
        pcVar3 = "skipped";
      }
      pcVar5 = print_token(exp->tokens[*exp_idx]);
      ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_number",pcVar3,pcVar5,
                 (ulong)exp->expr_pos[*exp_idx]);
    }
    *exp_idx = *exp_idx + 1;
    iVar4 = 0;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    strtold(exp->expr + exp->expr_pos[*exp_idx],&local_38);
    if (*piVar2 == 0) {
      if ((long)local_38 - (long)(exp->expr + exp->expr_pos[*exp_idx]) ==
          (ulong)exp->tok_len[*exp_idx]) {
        if ((set->type | LYXP_SET_NUMBER) == LYXP_SET_STRING) {
          free((set->val).nodes);
        }
        set->type = LYXP_SET_NUMBER;
        (set->val).num = in_ST0;
        goto LAB_0016c9d8;
      }
      ly_vlog(LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,"Unknown");
      bVar1 = exp->tok_len[*exp_idx];
      pcVar5 = exp->expr + exp->expr_pos[*exp_idx];
      pcVar3 = "Failed to convert \"%.*s\" into a long double.";
    }
    else {
      ly_vlog(LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,"Unknown",exp->expr + exp->expr_pos[*exp_idx]
             );
      bVar1 = exp->tok_len[*exp_idx];
      pcVar5 = exp->expr + exp->expr_pos[*exp_idx];
      strerror(*piVar2);
      pcVar3 = "Failed to convert \"%.*s\" into a long double (%s).";
    }
    iVar4 = -1;
    ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,pcVar3,(ulong)bVar1,pcVar5);
  }
  return iVar4;
}

Assistant:

static int
eval_number(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyxp_set *set)
{
    long double num;
    char *endptr;

    if (set) {
        errno = 0;
        num = strtold(&exp->expr[exp->expr_pos[*exp_idx]], &endptr);
        if (errno) {
            LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, "Unknown", &exp->expr[exp->expr_pos[*exp_idx]]);
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Failed to convert \"%.*s\" into a long double (%s).",
                   exp->tok_len[*exp_idx], &exp->expr[exp->expr_pos[*exp_idx]], strerror(errno));
            return -1;
        } else if (endptr - &exp->expr[exp->expr_pos[*exp_idx]] != exp->tok_len[*exp_idx]) {
            LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, "Unknown", &exp->expr[exp->expr_pos[*exp_idx]]);
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Failed to convert \"%.*s\" into a long double.",
                   exp->tok_len[*exp_idx], &exp->expr[exp->expr_pos[*exp_idx]]);
            return -1;
        }

        set_fill_number(set, num);
    }

    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);
    return EXIT_SUCCESS;
}